

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

void __thiscall sznet::net::Buffer::shrink(Buffer *this,size_t reserve)

{
  size_t sVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  Buffer local_60;
  
  Buffer(&local_60,4,0x400);
  ensureWritableBytes(&local_60,(reserve + this->m_writerIndex) - this->m_readerIndex);
  sVar1 = this->m_readerIndex;
  pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pointer)(long)((int)this->m_writerIndex - (int)sVar1);
  ensureWritableBytes(&local_60,(size_t)pcVar5);
  memcpy(local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start + local_60.m_writerIndex,pcVar2 + sVar1,(size_t)pcVar5);
  if (pcVar5 <= local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish +
                (-(long)local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start - local_60.m_writerIndex)) {
    pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar2 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    pcVar5 = pcVar5 + local_60.m_writerIndex;
    (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage =
         local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    sVar1 = this->m_readerIndex;
    this->m_readerIndex = local_60.m_readerIndex;
    local_60.m_writerIndex = this->m_writerIndex;
    this->m_writerIndex = (size_t)pcVar5;
    this->m_wrapSize =
         (ulong)(((long)local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                 (long)local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start) * 3) >> 2;
    if (pcVar2 != (pointer)0x0) {
      local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = pcVar2;
      local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
      local_60.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pcVar4;
      local_60.m_readerIndex = sVar1;
      operator_delete(pcVar2);
    }
    return;
  }
  __assert_fail("len <= writableBytes()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0xd4,"void sznet::net::Buffer::hasWritten(size_t)");
}

Assistant:

void shrink(size_t reserve)
	{
		// FIXME: use vector::shrink_to_fit() in C++ 11 if possible.
		Buffer other;
		other.ensureWritableBytes(readableBytes() + reserve);
		other.append(toStringPiece());
		swap(other);
		m_wrapSize = m_buffer.capacity() * 3 / 4;
	}